

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::add
          (RequiredExtensions *this,char *ext)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  iterator __position;
  bool bVar3;
  deBool dVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char *local_20;
  
  ppcVar2 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)(this->m_extensions).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2) >> 3);
  bVar3 = 0 < iVar5;
  local_20 = ext;
  if (0 < iVar5) {
    dVar4 = deStringEqual(*ppcVar2,ext);
    if (dVar4 != 1) {
      lVar7 = 1;
      do {
        ppcVar2 = (this->m_extensions).
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar6 = (long)(int)((ulong)((long)(this->m_extensions).
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2
                                   ) >> 3);
        bVar3 = lVar7 < lVar6;
        if (lVar6 <= lVar7) goto LAB_007e21ab;
        dVar4 = deStringEqual(ppcVar2[lVar7],local_20);
        lVar7 = lVar7 + 1;
      } while (dVar4 != 1);
    }
    if (bVar3) {
      return;
    }
  }
LAB_007e21ab:
  __position._M_current =
       (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)this,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppcVar1 = &(this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void RequiredExtensions::add (const char* ext)
{
	for (int ndx = 0; ndx < (int)m_extensions.size(); ++ndx)
		if (deStringEqual(m_extensions[ndx], ext) == DE_TRUE)
			return;
	m_extensions.push_back(ext);
}